

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int getn(vorb *z,uint8 *data,int n)

{
  size_t sVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    sVar1 = fread(in_RSI,(long)in_EDX,1,*(FILE **)(in_RDI + 0x30));
    if (sVar1 == 1) {
      local_4 = 1;
    }
    else {
      *(undefined4 *)(in_RDI + 0x98) = 1;
      local_4 = 0;
    }
  }
  else if (*(ulong *)(in_RDI + 0x50) < (ulong)(*(long *)(in_RDI + 0x40) + (long)in_EDX)) {
    *(undefined4 *)(in_RDI + 0x98) = 1;
    local_4 = 0;
  }
  else {
    memcpy(in_RSI,*(void **)(in_RDI + 0x40),(long)in_EDX);
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + (long)in_EDX;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int getn(vorb *z, uint8 *data, int n)
{
   if (USE_MEMORY(z)) {
      if (z->stream+n > z->stream_end) { z->eof = 1; return 0; }
      memcpy(data, z->stream, n);
      z->stream += n;
      return 1;
   }

   #ifndef STB_VORBIS_NO_STDIO
   if (fread(data, n, 1, z->f) == 1)
      return 1;
   else {
      z->eof = 1;
      return 0;
   }
   #endif
}